

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

int enum_max(MetaContainer meta)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  MetaContainer str;
  char *pcVar5;
  MetaIterator __begin1;
  MetaIterator local_50;
  MetaIterator local_40;
  
  str.str_ptr = meta.str_ptr;
  if ((meta.str_ptr != (char *)0x0) && (*meta.str_ptr == ':')) {
    str.str_ptr = meta.str_ptr + 1;
  }
  rtosc::Port::MetaIterator::MetaIterator(&local_40,str.str_ptr);
  pcVar5 = local_40.title;
  local_50.title = local_40.title;
  local_50.value = local_40.value;
  iVar1 = 0;
  rtosc::Port::MetaIterator::MetaIterator(&local_40,(char *)0x0);
  pcVar4 = local_40.title;
  if (pcVar5 != local_40.title) {
    iVar1 = 0;
    do {
      pcVar3 = strstr(pcVar5,"map ");
      if (pcVar3 != (char *)0x0) {
        iVar1 = atoi(pcVar5 + 4);
      }
      rtosc::Port::MetaIterator::operator++(&local_50);
      pcVar5 = local_50.title;
    } while (local_50.title != pcVar4);
  }
  if ((meta.str_ptr != (char *)0x0) && (*meta.str_ptr == ':')) {
    meta.str_ptr = meta.str_ptr + 1;
  }
  rtosc::Port::MetaIterator::MetaIterator(&local_40,meta.str_ptr);
  pcVar5 = local_40.title;
  local_50.title = local_40.title;
  local_50.value = local_40.value;
  rtosc::Port::MetaIterator::MetaIterator(&local_40,(char *)0x0);
  if (pcVar5 != local_40.title) {
    do {
      pcVar4 = strstr(pcVar5,"map ");
      if ((pcVar4 != (char *)0x0) && (iVar2 = atoi(pcVar5 + 4), iVar1 <= iVar2)) {
        iVar1 = iVar2;
      }
      rtosc::Port::MetaIterator::operator++(&local_50);
      pcVar5 = local_50.title;
    } while (local_50.title != local_40.title);
  }
  return iVar1;
}

Assistant:

static int enum_max(Port::MetaContainer meta)
{
    int max = 0;
    for(auto m:meta)
        if(strstr(m.title, "map "))
            max = atoi(m.title+4);

    for(auto m:meta)
        if(strstr(m.title, "map "))
            max = max<atoi(m.title+4) ? atoi(m.title+4) : max;

    return max;
}